

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool lower_first)

{
  bool bVar1;
  char cVar2;
  reference pcVar3;
  ulong uVar4;
  char *pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char i;
  const_iterator __end3;
  const_iterator __begin3;
  string *__range3;
  byte local_1a;
  bool capitalize_next;
  bool lower_first_local;
  string *input_local;
  string *result;
  
  local_1a = ~lower_first & 1;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end3._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffb8), bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end3);
    if (*pcVar3 == '_') {
      local_1a = 1;
    }
    else if (local_1a == 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      ToUpperCh(*pcVar3);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      local_1a = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end3);
  }
  if ((lower_first) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    cVar2 = ToLowerCh(*pcVar5);
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *pcVar5 = cVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToCamelCase(const std::string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char i : input) {
    if (i == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpperCh(i));
      capitalize_next = false;
    } else {
      result.push_back(i);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLowerCh(result[0]);
  }

  return result;
}